

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ExpressionSyntax::isKind(SyntaxKind kind)

{
  switch(kind) {
  case StreamingConcatenationExpression:
  case StringLiteralExpression:
  case StringType:
  case StructType:
  case SubtractAssignmentExpression:
  case SubtractExpression:
  case SuperHandle:
  case SuperNewDefaultedArgsExpression:
  case SystemName:
  case TaggedUnionExpression:
  case ThisHandle:
  case TimeLiteralExpression:
  case TimeType:
  case TimingControlExpression:
  case TypeReference:
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseNotExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
  case UnaryLogicalNotExpression:
  case UnaryMinusExpression:
  case UnaryPlusExpression:
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
  case UnbasedUnsizedLiteralExpression:
  case UnionType:
  case UnitScope:
  case Untyped:
  case ValueRangeExpression:
  case VirtualInterfaceType:
  case VoidType:
  case WildcardEqualityExpression:
  case WildcardInequalityExpression:
  case WildcardLiteralExpression:
  case XorAssignmentExpression:
    goto switchD_0017da1c_caseD_1bb;
  case StrongWeakPropertyExpr:
  case StructUnionMember:
  case StructurePattern:
  case StructuredAssignmentPattern:
  case SystemTimingCheck:
  case TaggedPattern:
  case TaskDeclaration:
  case ThroughoutSequenceExpr:
  case TimeScaleDirective:
  case TimeUnitsDeclaration:
  case TimingCheckEventArg:
  case TimingCheckEventCondition:
  case TimingControlStatement:
  case TransListCoverageBinInitializer:
  case TransRange:
  case TransRepeatRange:
  case TransSet:
  case TypeAssignment:
  case TypeParameterDeclaration:
  case TypedefDeclaration:
  case UdpBody:
  case UdpDeclaration:
  case UdpEdgeField:
  case UdpEntry:
  case UdpInitialStmt:
  case UdpInputPortDecl:
  case UdpOutputPortDecl:
  case UdpSimpleField:
  case UnaryBinsSelectExpr:
  case UnaryConditionalDirectiveExpression:
  case UnaryPropertyExpr:
  case UnarySelectPropertyExpr:
  case UnconnectedDriveDirective:
  case UndefDirective:
  case UndefineAllDirective:
  case UniquenessConstraint:
  case UntilPropertyExpr:
  case UntilWithPropertyExpr:
  case UserDefinedNetDeclaration:
  case VariableDimension:
  case VariablePattern:
  case VariablePortHeader:
  case VoidCastedCallStatement:
  case WaitForkStatement:
  case WaitOrderStatement:
  case WaitStatement:
  case WildcardDimensionSpecifier:
  case WildcardPattern:
  case WildcardPortConnection:
  case WildcardPortList:
  case WildcardUdpPortList:
  case WithClause:
  case WithFunctionClause:
  case WithFunctionSample:
  case WithinSequenceExpr:
    return false;
  default:
    if ((((((0x3a < kind - AddAssignmentExpression) ||
           ((0x4b907090c3fe043U >> ((ulong)(kind - AddAssignmentExpression) & 0x3f) & 1) == 0)) &&
          ((0x3d < kind - GreaterThanEqualExpression ||
           ((0x3ff40d0794800063U >> ((ulong)(kind - GreaterThanEqualExpression) & 0x3f) & 1) == 0)))
          ) && ((0x3f < kind - MemberAccessExpression ||
                ((0x80000128c201c00fU >> ((ulong)(kind - MemberAccessExpression) & 0x3f) & 1) == 0))
               )) &&
        ((0x39 < kind - PostdecrementExpression ||
         ((0x2d10020f0008007U >> ((ulong)(kind - PostdecrementExpression) & 0x3f) & 1) == 0)))) &&
       ((0x2b < kind - DivideAssignmentExpression ||
        ((0x820c0440803U >> ((ulong)(kind - DivideAssignmentExpression) & 0x3f) & 1) == 0)))) {
      if (0x39 < kind - ClassName) {
        return false;
      }
      if ((0x200000050004801U >> ((ulong)(kind - ClassName) & 0x3f) & 1) == 0) {
        return false;
      }
    }
switchD_0017da1c_caseD_1bb:
    return true;
  }
}

Assistant:

bool ExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::AddExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::ArrayAndMethod:
        case SyntaxKind::ArrayOrMethod:
        case SyntaxKind::ArrayOrRandomizeMethodExpression:
        case SyntaxKind::ArrayUniqueMethod:
        case SyntaxKind::ArrayXorMethod:
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AssignmentPatternExpression:
        case SyntaxKind::BadExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BitType:
        case SyntaxKind::ByteType:
        case SyntaxKind::CHandleType:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::CastExpression:
        case SyntaxKind::ClassName:
        case SyntaxKind::ConcatenationExpression:
        case SyntaxKind::ConditionalExpression:
        case SyntaxKind::ConstructorName:
        case SyntaxKind::CopyClassExpression:
        case SyntaxKind::DefaultPatternKeyExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ElementSelectExpression:
        case SyntaxKind::EmptyIdentifierName:
        case SyntaxKind::EmptyQueueExpression:
        case SyntaxKind::EnumType:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::EventType:
        case SyntaxKind::ExpressionOrDist:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ImplicitType:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::InsideExpression:
        case SyntaxKind::IntType:
        case SyntaxKind::IntegerLiteralExpression:
        case SyntaxKind::IntegerType:
        case SyntaxKind::IntegerVectorExpression:
        case SyntaxKind::InvocationExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::LocalScope:
        case SyntaxKind::LogicType:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::LongIntType:
        case SyntaxKind::MemberAccessExpression:
        case SyntaxKind::MinTypMaxExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::MultipleConcatenationExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::NamedType:
        case SyntaxKind::NewArrayExpression:
        case SyntaxKind::NewClassExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
        case SyntaxKind::NullLiteralExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::ParenthesizedExpression:
        case SyntaxKind::PostdecrementExpression:
        case SyntaxKind::PostincrementExpression:
        case SyntaxKind::PowerExpression:
        case SyntaxKind::PropertyType:
        case SyntaxKind::RealLiteralExpression:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::RealType:
        case SyntaxKind::RegType:
        case SyntaxKind::RootScope:
        case SyntaxKind::ScopedName:
        case SyntaxKind::SequenceType:
        case SyntaxKind::ShortIntType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::SignedCastExpression:
        case SyntaxKind::StreamingConcatenationExpression:
        case SyntaxKind::StringLiteralExpression:
        case SyntaxKind::StringType:
        case SyntaxKind::StructType:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::SuperHandle:
        case SyntaxKind::SuperNewDefaultedArgsExpression:
        case SyntaxKind::SystemName:
        case SyntaxKind::TaggedUnionExpression:
        case SyntaxKind::ThisHandle:
        case SyntaxKind::TimeLiteralExpression:
        case SyntaxKind::TimeType:
        case SyntaxKind::TimingControlExpression:
        case SyntaxKind::TypeReference:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryPredecrementExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
        case SyntaxKind::UnionType:
        case SyntaxKind::UnitScope:
        case SyntaxKind::Untyped:
        case SyntaxKind::ValueRangeExpression:
        case SyntaxKind::VirtualInterfaceType:
        case SyntaxKind::VoidType:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::WildcardLiteralExpression:
        case SyntaxKind::XorAssignmentExpression:
            return true;
        default:
            return false;
    }
}